

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeRAW.cpp
# Opt level: O0

uint __thiscall FormatTypeRAW::ComputeTrack(FormatTypeRAW *this,int index,Revolution *revolution)

{
  int iVar1;
  reference pvVar2;
  int *__b;
  uint *puVar3;
  int local_88;
  int local_84;
  int local_80;
  uint local_7c;
  int diff;
  int localflux;
  uint k;
  int end_flux;
  int remaining_negative;
  int remaining;
  double last_flux_value;
  double first_flux_value;
  ulong uStack_50;
  uint j;
  IndexElement fin;
  IndexElement debut;
  int clocked_zeros;
  uint nb_bit_in_flux;
  uint i;
  int clock_centre;
  int clock;
  int flux;
  Revolution *revolution_local;
  FormatTypeRAW *pFStack_10;
  int index_local;
  FormatTypeRAW *this_local;
  
  clock_centre = 0;
  i = 2000;
  debut.stream_position = 0;
  _clock = revolution;
  revolution_local._4_4_ = index;
  pFStack_10 = this;
  pvVar2 = std::vector<FormatTypeRAW::IndexElement,_std::allocator<FormatTypeRAW::IndexElement>_>::
           operator[](&this->index_list_,(long)index);
  fin.stream_position = pvVar2->flux_value;
  fin.index_clock = pvVar2->stream_position;
  pvVar2 = std::vector<FormatTypeRAW::IndexElement,_std::allocator<FormatTypeRAW::IndexElement>_>::
           operator[](&this->index_list_,(long)(revolution_local._4_4_ + 1));
  uStack_50._0_4_ = pvVar2->flux_value;
  uStack_50._4_4_ = pvVar2->stream_position;
  fin.flux_value = pvVar2->index_clock;
  clocked_zeros = 0;
  while (((uint)clocked_zeros < this->nb_flux_value_ &&
         (this->flux_list_[(uint)clocked_zeros].stream_position < fin.index_clock))) {
    clocked_zeros = clocked_zeros + 1;
  }
  first_flux_value._4_4_ = clocked_zeros;
  while ((first_flux_value._4_4_ < this->nb_flux_value_ &&
         (this->flux_list_[first_flux_value._4_4_].stream_position != uStack_50._4_4_))) {
    first_flux_value._4_4_ = first_flux_value._4_4_ + 1;
  }
  debut.index_clock = 0;
  last_flux_value = (double)(fin._4_8_ & 0xffffffff);
  _remaining_negative = (double)(uStack_50 & 0xffffffff);
  end_flux = 0;
  k = 0;
  if (clocked_zeros != 0) {
    if ((double)this->flux_list_[clocked_zeros - 1].flux_value <= last_flux_value) {
      k = (int)last_flux_value - this->flux_list_[clocked_zeros - 1].flux_value;
    }
    else {
      end_flux = this->flux_list_[clocked_zeros - 1].flux_value - (int)last_flux_value;
    }
  }
  clock_centre = (uint)(end_flux * 0xa293) / 1000;
  localflux = 0;
  diff = clocked_zeros;
  while ((uint)diff < first_flux_value._4_4_) {
    if ((clock_centre < (int)i / 2) && ((uint)diff < first_flux_value._4_4_)) {
      local_7c = this->flux_list_[(uint)diff].flux_value;
      if (diff == clocked_zeros) {
        local_7c = local_7c - k;
      }
      else if (diff + 1U == first_flux_value._4_4_) {
        localflux = (int)((_remaining_negative * 41619.0) / 1000.0 - (double)(int)i);
      }
      clock_centre = (local_7c * 0xa293) / 1000 + clock_centre;
      debut.stream_position = 0;
      diff = diff + 1U;
    }
    clock_centre = clock_centre - i;
    if (clock_centre < (int)i / 2) {
      if (_clock != (Revolution *)0x0) {
        _clock[revolution_local._4_4_].bitfield[debut.index_clock] = '\x01';
      }
      if (((int)debut.stream_position < 1) || (3 < (int)debut.stream_position)) {
        iVar1 = (int)((2000 - i) * 5) / 100;
      }
      else {
        local_80 = clock_centre / (int)(debut.stream_position + 1);
        iVar1 = local_80 / 5;
      }
      i = iVar1 + i;
      local_84 = 0x708;
      local_88 = 0x898;
      __b = std::min<int>(&local_88,(int *)&i);
      puVar3 = (uint *)std::max<int>(&local_84,__b);
      i = *puVar3;
      clock_centre = clock_centre / 2;
    }
    else {
      if (_clock != (Revolution *)0x0) {
        _clock[revolution_local._4_4_].bitfield[debut.index_clock] = '\0';
      }
      debut.stream_position = debut.stream_position + 1;
    }
    debut.index_clock = debut.index_clock + 1;
  }
  while ((int)i / 2 <= clock_centre && 0 < localflux) {
    clock_centre = clock_centre - i;
    localflux = localflux - i;
    if (clock_centre < (int)i / 2) {
      if (_clock != (Revolution *)0x0) {
        _clock[revolution_local._4_4_].bitfield[debut.index_clock] = '\x01';
      }
    }
    else if (_clock != (Revolution *)0x0) {
      _clock[revolution_local._4_4_].bitfield[debut.index_clock] = '\0';
    }
    debut.index_clock = debut.index_clock + 1;
  }
  return debut.index_clock;
}

Assistant:

unsigned int FormatTypeRAW::ComputeTrack(int index, IDisk::Revolution* revolution)
{
#define CLOCK_MAX_ADJ 10
#define CLOCK_MIN(_c) (((_c) * (100 - CLOCK_MAX_ADJ)) / 100)
#define CLOCK_MAX(_c) (((_c) * (100 + CLOCK_MAX_ADJ)) / 100)

#define MCK_FREQ (((18432000 * 73) / 14) / 2)
#define SCK_FREQ (MCK_FREQ / 2)
#define ICK_FREQ (MCK_FREQ / 16)
#define SCK_PS_PER_TICK (1000000000/(SCK_FREQ/1000))
#define PERIOD_ADJ_PCT 5

   int flux = 0;
   int clock = 2000; // 2 us
   int clock_centre = clock;
   unsigned int i = 0;
   unsigned int nb_bit_in_flux = 0;
   int clocked_zeros = 0;

   IndexElement debut = index_list_[index];
   IndexElement fin = index_list_[index + 1];

   unsigned int j;
   double first_flux_value = 0, last_flux_value = 0;
   // Get next cell
   for (i = 0; i < nb_flux_value_; i++)
   {
      if (flux_list_[i].stream_position >= debut.stream_position)
      {
         break;
      }
   }
   for (j = i; j < nb_flux_value_; j++)
   {
      if (flux_list_[j].stream_position == fin.stream_position)
      {
         //last_flux_value = fin.flux_value; // m_FluxList[j].flux_value;
         //j --;
         break;
      }
   }
   nb_bit_in_flux = 0;

   // Get the proper first cell
   first_flux_value = debut.flux_value;
   last_flux_value = fin.flux_value;

   int remaining = 0;
   int remaining_negative = 0;
   // Value of the first cell :
   if (i > 0)
   {
      if (flux_list_[i - 1].flux_value > first_flux_value)
         remaining = flux_list_[i - 1].flux_value - static_cast<int>(first_flux_value);
      else
         remaining_negative = static_cast<int>(first_flux_value) - flux_list_[i - 1].flux_value;
   }

   // Adjust first / last, to avoid having a double bit


   // Cell first ??
   flux = (remaining * SCK_PS_PER_TICK) / 1000u;
   int end_flux = 0;
   //flux = remaining;

   unsigned int k = i;
   //i = 0;
   //while (i < sizeOfBuffer*2)
   for (; k < j;)
   {
      // What's the current flux status
      // Under a half clock : add the next one
      if (flux < clock / 2 && k < j)
      {
         int localflux = flux_list_[k++].flux_value;
         if (k - 1 == i)
         {
            localflux -= remaining_negative;
         }
         else if (k == j)
         {
            end_flux = static_cast<int>((last_flux_value * SCK_PS_PER_TICK) / 1000u - clock);
            // Compute last flux : It's xomputed to know WHEN to stop, not WHAT is it containing.

            /*
            if (last_flux_value < localflux)
            localflux = last_flux_value;
            else
            {
            // To check
            int dbg = 1;
            localflux = last_flux_value;
            }*/
         }

         flux += (localflux * SCK_PS_PER_TICK) / 1000u;
         clocked_zeros = 0;
      }

      // Remove a clock value to the flux
      flux -= clock;

      // If it remains at least a half clock : A zero's there
      if (flux >= clock / 2)
      {
         if (revolution != NULL) revolution[index].bitfield[nb_bit_in_flux] = 0;
         clocked_zeros++;
         nb_bit_in_flux++;
      }
      else
      {
         // Otherwise, we have a one
         if (revolution != NULL) revolution[index].bitfield[nb_bit_in_flux] = 1;
         nb_bit_in_flux++;

         // PLL computations HERE !
         if ((clocked_zeros >= 1) && (clocked_zeros <= 3))
         {
            // In sync: adjust base clock by 10% of phase mismatch.
            int diff = flux / (int)(clocked_zeros + 1);
            clock += diff / PERIOD_ADJ_PCT;
         }
         else
         {
            clock += (clock_centre - clock) * PERIOD_ADJ_PCT / 100;
         }


         clock = max(CLOCK_MIN(clock_centre),
                     min(CLOCK_MAX(clock_centre), clock));

         flux = flux / 2;
      }
   }

   // End adjustement
   while (flux >= clock / 2 && end_flux > 0)
   {
      flux -= clock;
      end_flux -= clock;

      // If it remains at least a half clock : A zero's there
      if (flux >= clock / 2)
      {
         if (revolution != NULL) revolution[index].bitfield[nb_bit_in_flux] = 0;
         clocked_zeros++;
         nb_bit_in_flux++;
      }
      else
      {
         // NOT ALWAYS : We have a ending one when the last flux reversal is smaller than the flux index
         // Otherwise, we have a one
         //if (last_flux_value > m_FluxList[j-1].flux_value )
         // This should be rethought and adjusted.... TODO
         //if (flux >= -(clock / 2))
         {
            // To check
            if (revolution != NULL) revolution[index].bitfield[nb_bit_in_flux] = 1;
            nb_bit_in_flux++;
         }
      }
   }

   return nb_bit_in_flux;
}